

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

QString * commandLinesForOutput(QString *__return_storage_ptr__,QStringList *commands)

{
  QString *pQVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  long i;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayData *local_78;
  undefined8 *puStack_70;
  undefined8 local_68;
  QArrayData *local_58;
  undefined8 *puStack_50;
  undefined8 local_48;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  if (commandLinesForOutput(QList<QString>)::errchk == '\0') {
    commandLinesForOutput();
  }
  uVar4 = (int)(commands->d).size - 2;
  if (-1 < (int)uVar4) {
    lVar5 = (ulong)uVar4 * 0x18;
    i = (ulong)uVar4 + 1;
    do {
      pQVar1 = (commands->d).ptr;
      QVar7.m_data = (storage_type *)0x3;
      QVar7.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar7);
      local_78 = local_58;
      puStack_70 = puStack_50;
      local_68 = local_48;
      cVar3 = QString::startsWith((QString *)((long)&(pQVar1->d).d + lVar5),
                                  (CaseSensitivity)&local_78);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      if (cVar3 == '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)commands,i,&commandLinesForOutput::errchk);
        QList<QString>::begin(commands);
      }
      lVar5 = lVar5 + -0x18;
      lVar6 = i + -1;
      bVar2 = 0 < i;
      i = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  QVar8.m_data = (storage_type *)0x2;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar8);
  if (puStack_50 == (undefined8 *)0x0) {
    puStack_50 = &QString::_empty;
  }
  QtPrivate::QStringList_join
            ((QList *)__return_storage_ptr__,(QChar *)commands,(longlong)puStack_50);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString commandLinesForOutput(QStringList commands)
{
    // MSBuild puts the contents of the custom commands into a batch file and calls it.
    // As we want every sub-command to be error-checked (as is done by makefile-based
    // backends), we insert the checks ourselves, using the undocumented jump target.
    static QString errchk = QStringLiteral("if errorlevel 1 goto VCEnd");
    for (int i = commands.size() - 2; i >= 0; --i) {
        if (!commands.at(i).startsWith("rem", Qt::CaseInsensitive))
            commands.insert(i + 1, errchk);
    }
    return commands.join("\r\n");
}